

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O3

void MPLSParser::composeExtensionData
               (BitStreamWriter *writer,
               vector<ExtDataBlockInfo,_std::allocator<ExtDataBlockInfo>_> *extDataBlockInfo)

{
  int iVar1;
  uint *puVar2;
  uint *puVar3;
  pointer pEVar4;
  byte *pbVar5;
  int iVar6;
  int iVar7;
  uint32_t uVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  uchar *j;
  byte *pbVar12;
  uint value;
  ulong uVar13;
  vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> extDataStartAddrPos;
  vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> local_58;
  ulong local_38;
  
  local_58.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::resize
            (&local_58,
             (long)(extDataBlockInfo->
                   super__Vector_base<ExtDataBlockInfo,_std::allocator<ExtDataBlockInfo>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(extDataBlockInfo->
                   super__Vector_base<ExtDataBlockInfo,_std::allocator<ExtDataBlockInfo>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 5);
  puVar2 = (writer->super_BitStream).m_initBuffer;
  iVar6 = *(int *)&(writer->super_BitStream).m_buffer - (int)puVar2;
  iVar1 = writer->m_bitWrited + iVar6 * 8;
  iVar6 = writer->m_bitWrited + iVar6 * 8 + 7;
  if (-1 < iVar1) {
    iVar6 = iVar1;
  }
  BitStreamWriter::putBits(writer,0x20,0);
  iVar7 = *(int *)&(writer->super_BitStream).m_buffer -
          *(int *)&(writer->super_BitStream).m_initBuffer;
  iVar1 = writer->m_bitWrited + iVar7 * 8;
  iVar7 = writer->m_bitWrited + iVar7 * 8 + 7;
  if (-1 < iVar1) {
    iVar7 = iVar1;
  }
  iVar7 = iVar7 >> 3;
  if ((extDataBlockInfo->super__Vector_base<ExtDataBlockInfo,_std::allocator<ExtDataBlockInfo>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (extDataBlockInfo->super__Vector_base<ExtDataBlockInfo,_std::allocator<ExtDataBlockInfo>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    BitStreamWriter::putBits(writer,0x20,0);
    BitStreamWriter::putBits(writer,0x18,0);
    uVar13 = (ulong)((long)(extDataBlockInfo->
                           super__Vector_base<ExtDataBlockInfo,_std::allocator<ExtDataBlockInfo>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(extDataBlockInfo->
                          super__Vector_base<ExtDataBlockInfo,_std::allocator<ExtDataBlockInfo>_>).
                          _M_impl.super__Vector_impl_data._M_start) >> 5;
    value = (uint)uVar13;
    BitStreamWriter::putBits(writer,8,value);
    if (value != 0) {
      lVar11 = 0;
      do {
        BitStreamWriter::putBits
                  (writer,0x10,
                   (&((extDataBlockInfo->
                      super__Vector_base<ExtDataBlockInfo,_std::allocator<ExtDataBlockInfo>_>).
                      _M_impl.super__Vector_impl_data._M_start)->id1)[lVar11]);
        BitStreamWriter::putBits
                  (writer,0x10,
                   (&((extDataBlockInfo->
                      super__Vector_base<ExtDataBlockInfo,_std::allocator<ExtDataBlockInfo>_>).
                      _M_impl.super__Vector_impl_data._M_start)->id2)[lVar11]);
        puVar3 = (writer->super_BitStream).m_initBuffer;
        iVar9 = *(int *)&(writer->super_BitStream).m_buffer - (int)puVar3;
        iVar1 = writer->m_bitWrited + iVar9 * 8;
        iVar9 = writer->m_bitWrited + iVar9 * 8 + 7;
        if (-1 < iVar1) {
          iVar9 = iVar1;
        }
        *(long *)((long)local_58.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar11) =
             (long)(iVar9 >> 3) + (long)puVar3;
        BitStreamWriter::putBits(writer,0x20,0);
        pEVar4 = (extDataBlockInfo->
                 super__Vector_base<ExtDataBlockInfo,_std::allocator<ExtDataBlockInfo>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        BitStreamWriter::putBits
                  (writer,0x20,
                   *(int *)((long)&(pEVar4->data).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl + lVar11 * 4 + 8) -
                   *(int *)((long)&(pEVar4->data).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl + lVar11 * 4));
        lVar11 = lVar11 + 8;
      } while ((uVar13 & 0xffffffff) << 3 != lVar11);
    }
    while( true ) {
      iVar9 = *(int *)&(writer->super_BitStream).m_buffer -
              *(int *)&(writer->super_BitStream).m_initBuffer;
      iVar1 = writer->m_bitWrited + iVar9 * 8;
      iVar9 = writer->m_bitWrited + iVar9 * 8 + 7;
      if (-1 < iVar1) {
        iVar9 = iVar1;
      }
      uVar10 = (iVar9 >> 3) - iVar7;
      if ((uVar10 & 3) == 0) break;
      BitStreamWriter::putBits(writer,0x10,0);
    }
    uVar8 = my_ntohl(uVar10 + 4);
    *(uint32_t *)((long)puVar2 + (long)(iVar6 >> 3) + 4) = uVar8;
    if (value != 0) {
      local_38 = uVar13 & 0xffffffff;
      uVar13 = 0;
      do {
        iVar9 = *(int *)&(writer->super_BitStream).m_buffer -
                *(int *)&(writer->super_BitStream).m_initBuffer;
        iVar1 = writer->m_bitWrited + iVar9 * 8;
        iVar9 = writer->m_bitWrited + iVar9 * 8 + 7;
        if (-1 < iVar1) {
          iVar9 = iVar1;
        }
        uVar8 = my_ntohl(((iVar9 >> 3) - iVar7) + 4);
        *local_58.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
         super__Vector_impl_data._M_start[uVar13] = uVar8;
        pEVar4 = (extDataBlockInfo->
                 super__Vector_base<ExtDataBlockInfo,_std::allocator<ExtDataBlockInfo>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pbVar5 = *(pointer *)
                  ((long)&pEVar4[uVar13].data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  + 8);
        for (pbVar12 = *(byte **)&pEVar4[uVar13].data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl; pbVar12 != pbVar5; pbVar12 = pbVar12 + 1) {
          BitStreamWriter::putBits(writer,8,(uint)*pbVar12);
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != local_38);
    }
  }
  iVar9 = *(int *)&(writer->super_BitStream).m_buffer -
          *(int *)&(writer->super_BitStream).m_initBuffer;
  iVar1 = writer->m_bitWrited + iVar9 * 8;
  iVar9 = writer->m_bitWrited + iVar9 * 8 + 7;
  if (-1 < iVar1) {
    iVar9 = iVar1;
  }
  uVar8 = my_ntohl((iVar9 >> 3) - iVar7);
  *(uint32_t *)((long)puVar2 + (long)(iVar6 >> 3)) = uVar8;
  if (local_58.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void MPLSParser::composeExtensionData(BitStreamWriter& writer, const vector<ExtDataBlockInfo>& extDataBlockInfo)
{
    vector<uint32_t*> extDataStartAddrPos;
    extDataStartAddrPos.resize(extDataBlockInfo.size());
    const auto lengthPos = reinterpret_cast<uint32_t*>(writer.getBuffer() + writer.getBitsCount() / 8);
    writer.putBits(32, 0);  // length
    const int initPos = writer.getBitsCount() / 8;
    if (!extDataBlockInfo.empty())
    {
        writer.putBits(32, 0);  // data_block_start_address
        writer.putBits(24, 0);  // reserved_for_word_align
        const auto extDataBlockInfoSize = static_cast<unsigned>(extDataBlockInfo.size());
        writer.putBits(8, extDataBlockInfoSize);
        for (unsigned i = 0; i < extDataBlockInfoSize; ++i)
        {
            writer.putBits(16, extDataBlockInfo[i].id1);
            writer.putBits(16, extDataBlockInfo[i].id2);
            extDataStartAddrPos[i] = reinterpret_cast<uint32_t*>(writer.getBuffer() + writer.getBitsCount() / 8);
            writer.putBits(32, 0);                                                       // ext_data_start_address
            writer.putBits(32, static_cast<unsigned>(extDataBlockInfo[i].data.size()));  // ext_data_length
        }
        while ((writer.getBitsCount() / 8 - initPos) % 4 != 0) writer.putBits(16, 0);
        *(lengthPos + 1) = my_htonl(writer.getBitsCount() / 8 - initPos + 4);  // data_block_start_address
        for (unsigned i = 0; i < extDataBlockInfoSize; ++i)
        {
            *(extDataStartAddrPos[i]) = my_htonl(writer.getBitsCount() / 8 - initPos + 4);
            for (const auto& j : extDataBlockInfo[i].data) writer.putBits(8, j);
        }
    }

    *lengthPos = my_htonl(writer.getBitsCount() / 8 - initPos);
}